

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  long *plVar5;
  undefined8 extraout_RAX;
  undefined1 *puVar6;
  char *unaff_R15;
  string out;
  string in;
  string mode;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Tc;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  G;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A;
  string name;
  string ext;
  char *local_7d8;
  long local_7d0;
  char local_7c8 [16];
  char *local_7b8;
  long local_7b0;
  char local_7a8 [16];
  undefined1 *local_798 [2];
  undefined1 local_788 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_778;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_758;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_738;
  string local_720;
  string local_700;
  string local_6e0;
  undefined1 local_6c0 [672];
  filebuf local_420 [240];
  ios_base local_330 [280];
  undefined1 *local_218;
  filebuf local_210 [8];
  undefined1 local_208 [232];
  ios_base local_120 [264];
  
  puVar6 = (undefined1 *)(ulong)(uint)argc;
  if (argc - 5U < 0xfffffffe) goto LAB_0010928b;
  std::__cxx11::string::string((string *)local_798,argv[1],(allocator *)local_6c0);
  std::__cxx11::string::string((string *)&local_7b8,argv[2],(allocator *)local_6c0);
  unaff_R15 = local_7c8;
  local_7d0 = 0;
  local_7c8[0] = '\0';
  local_7d8 = unaff_R15;
  if (argc == 4) {
    std::__cxx11::string::string((string *)local_6c0,argv[3],(allocator *)&local_218);
    std::__cxx11::string::operator=((string *)&local_7d8,(string *)local_6c0);
    if ((undefined1 *)local_6c0._0_8_ != local_6c0 + 0x10) {
LAB_00108d90:
      operator_delete((void *)local_6c0._0_8_);
    }
LAB_00108d95:
    std::ifstream::ifstream(local_6c0,(string *)&local_7b8,_S_in);
    iVar2 = *(int *)(local_6c0 + *(long *)(local_6c0._0_8_ + -0x18) + 0x20);
    std::ifstream::~ifstream(local_6c0);
    if (iVar2 == 0) {
      iVar2 = std::__cxx11::string::compare((char *)local_798);
      if (iVar2 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Compressing file ",0x11);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_7b8,local_7b0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Output will be saved to file ",0x1d);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_7d8,local_7d0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        plVar5 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
        local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6e0,local_7b8,local_7b8 + local_7b0);
        compute_repair(&local_6e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
          operator_delete(local_6e0._M_dataplus._M_p);
        }
        local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_700,local_7d8,local_7d8 + local_7d0);
        packed_gamma_file3<unsigned_int,_6UL>::packed_gamma_file3
                  ((packed_gamma_file3<unsigned_int,_6UL> *)local_6c0,&local_700,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700._M_dataplus._M_p != &local_700.field_2) {
          operator_delete(local_700._M_dataplus._M_p);
        }
        packed_gamma_file3<unsigned_int,_6UL>::compress_and_store
                  ((packed_gamma_file3<unsigned_int,_6UL> *)local_6c0,&::A,&::G,&T_vec);
        local_6c0._664_8_ = _VTT;
        *(undefined8 *)(local_420 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Decompressing archive ",0x16);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_7b8,local_7b0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Output will be saved to ",0x18);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_7d8,local_7d0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_720,local_7b8,local_7b8 + local_7b0);
        packed_gamma_file3<unsigned_int,_6UL>::packed_gamma_file3
                  ((packed_gamma_file3<unsigned_int,_6UL> *)local_6c0,&local_720,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_dataplus._M_p != &local_720.field_2) {
          operator_delete(local_720._M_dataplus._M_p);
        }
        local_738.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_738.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_738.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_758.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_758.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_758.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_778.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_778.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_778.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        packed_gamma_file3<unsigned_int,_6UL>::read_and_decompress
                  ((packed_gamma_file3<unsigned_int,_6UL> *)local_6c0,&local_738,&local_758,
                   &local_778);
        std::ofstream::ofstream(&local_218,(string *)&local_7d8,_S_out);
        decompress(&local_738,&local_758,&local_778,(ofstream *)&local_218);
        std::ofstream::close();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        uVar1 = __filebuf;
        puVar6 = _VTT;
        local_218 = _VTT;
        *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
        std::filebuf::~filebuf(local_210);
        std::ios_base::~ios_base(local_120);
        if (local_778.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_778.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_758.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_758.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_738.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_738.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        local_6c0._664_8_ = puVar6;
        *(undefined8 *)(local_420 + *(long *)(puVar6 + -0x18) + -8) = uVar1;
      }
      std::filebuf::~filebuf(local_420);
      std::ios_base::~ios_base(local_330);
      std::ifstream::~ifstream(local_6c0 + 0x90);
      if ((pointer)local_6c0._112_8_ != (pointer)0x0) {
        operator_delete((void *)local_6c0._112_8_);
      }
      if ((pointer)local_6c0._80_8_ != (pointer)0x0) {
        operator_delete((void *)local_6c0._80_8_);
      }
      if ((_Bit_type *)local_6c0._32_8_ != (_Bit_type *)0x0) {
        operator_delete((void *)local_6c0._32_8_);
      }
      if (local_7d8 != unaff_R15) {
        operator_delete(local_7d8);
      }
      if (local_7b8 != local_7a8) {
        operator_delete(local_7b8);
      }
      if (local_798[0] != local_788) {
        operator_delete(local_798[0]);
      }
      return 0;
    }
  }
  else {
    std::__cxx11::string::string((string *)local_6c0,argv[2],(allocator *)&local_218);
    std::__cxx11::string::operator=((string *)&local_7d8,(string *)local_6c0);
    puVar6 = local_6c0 + 0x10;
    if ((undefined1 *)local_6c0._0_8_ != puVar6) {
      operator_delete((void *)local_6c0._0_8_);
    }
    iVar2 = std::__cxx11::string::compare((char *)local_798);
    if (iVar2 == 0) {
      std::__cxx11::string::append((char *)&local_7d8);
      goto LAB_00108d95;
    }
    iVar2 = std::__cxx11::string::compare((char *)local_798);
    if (iVar2 == 0) {
      lVar3 = std::__cxx11::string::find_last_of((char *)&local_7d8,0x1118d2,0xffffffffffffffff);
      if (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)local_6c0,(ulong)&local_7d8);
        std::__cxx11::string::substr((ulong)&local_218,(ulong)&local_7d8);
        iVar2 = std::__cxx11::string::compare((char *)&local_218);
        if (iVar2 == 0) {
          std::__cxx11::string::_M_assign((string *)&local_7d8);
        }
        else {
          std::__cxx11::string::append((char *)&local_7d8);
        }
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        if ((undefined1 *)local_6c0._0_8_ != puVar6) goto LAB_00108d90;
      }
      goto LAB_00108d95;
    }
  }
  help();
LAB_0010928b:
  help();
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if ((undefined1 *)local_6c0._0_8_ != puVar6) {
    operator_delete((void *)local_6c0._0_8_);
  }
  if (local_7d8 != unaff_R15) {
    operator_delete(local_7d8);
  }
  if (local_7b8 != local_7a8) {
    operator_delete(local_7b8);
  }
  if (local_798[0] != local_788) {
    operator_delete(local_798[0]);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc,char** argv) {

	if(argc!=3 and argc != 4) help();

	string mode(argv[1]);

	string in(argv[2]);
	string out;

	if(argc == 4){

		//use output name provided by user
		out = string(argv[3]);

	}else{

		out = string(argv[2]);

		if(mode.compare("c")==0){

			//if compress mode, append .rp
			out.append(".rp");

		}else if(mode.compare("d")==0){


			//if decompress mode, extract extension (if any)
			size_t dot = out.find_last_of(".");
			if (dot != std::string::npos){

				string name = out.substr(0, dot);
				string ext  = out.substr(dot, out.size() - dot);

				//if extension = .rp, remove it. Otherwise, add extension .decompressed
				if(ext.compare(".rp") == 0){

					out = name;

				}else{

					out.append(".decompressed");

				}

			}

		}else{

			help();

		}

	}

	if(not ifstream(in).good()) help();


	if(mode.compare("c")==0){

		cout << "Compressing file " << in << endl;
		cout << "Output will be saved to file " << out << endl<<endl;

		compute_repair(in);

		packed_gamma_file3<> out_file(out);
		//compress the grammar with Elias' gamma-encoding and store it to file
		out_file.compress_and_store(A,G,T_vec);

	}else{

		cout << "Decompressing archive " << in << endl;
		cout << "Output will be saved to " << out << endl;

		auto pgf = packed_gamma_file3<>(in, false);

		vector<itype> A;
		vector<pair<itype,itype> > G;
		vector<itype> Tc;

		//read and decompress grammar (the DAG)
		pgf.read_and_decompress(A,G,Tc);

		ofstream ofs(out);

		//expand the grammar to file
		decompress(A,G,Tc,ofs);

		ofs.close();

		cout << "done." << endl;

	}

}